

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

Context * __thiscall mp::Context::Add(Context *this,Context ct)

{
  bool bVar1;
  CtxVal in_ESI;
  Context *in_RDI;
  Context local_4;
  
  switch(in_RDI->value_) {
  case CTX_NONE:
    in_RDI->value_ = in_ESI;
    break;
  case CTX_ROOT:
  case CTX_POS:
    bVar1 = HasNegative(&local_4);
    if (bVar1) {
      in_RDI->value_ = CTX_MIX;
    }
    break;
  case CTX_NEG:
    bVar1 = HasPositive(&local_4);
    if (bVar1) {
      in_RDI->value_ = CTX_MIX;
    }
  }
  return in_RDI;
}

Assistant:

Context& Add(Context ct) {
    switch (value_) {          // Consider already stored value
    case CTX_NONE:
      value_ = ct.value_;
      break;
    case CTX_ROOT:
      MP_ASSERT(0, "Should not extend root context");
      [[fallthrough]];           // in release
    case CTX_POS:
      if (ct.HasNegative())
        value_ = CTX_MIX;
      break;
    case CTX_NEG:
      if (ct.HasPositive())
        value_ = CTX_MIX;
      break;
    default:
      break;
    }
    return *this;
  }